

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::Matchers::StdString::EqualsMatcher::match(EqualsMatcher *this,string *source)

{
  __type_conflict _Var1;
  string local_38;
  string *local_18;
  string *source_local;
  EqualsMatcher *this_local;
  
  local_18 = source;
  source_local = (string *)this;
  CasedString::adjustString(&local_38,&(this->super_StringMatcherBase).m_comparator,source);
  _Var1 = std::operator==(&local_38,&(this->super_StringMatcherBase).m_comparator.m_str);
  std::__cxx11::string::~string((string *)&local_38);
  return _Var1;
}

Assistant:

bool EqualsMatcher::match( std::string const& source ) const {
            return m_comparator.adjustString( source ) == m_comparator.m_str;
        }